

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall
CLI::Transformer::
Transformer<std::map<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli>>>*>
          (Transformer *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
          **mapping,filter_fn_t *filter_fn_1,filter_fn_t *filter_fn_2)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
  *mapping_00;
  anon_class_64_2_53a4bb40 local_68;
  filter_fn_t *local_28;
  filter_fn_t *filter_fn_2_local;
  filter_fn_t *filter_fn_1_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
  **mapping_local;
  Transformer *this_local;
  
  mapping_00 = *mapping;
  local_28 = filter_fn_2;
  filter_fn_2_local = filter_fn_1;
  filter_fn_1_local = (filter_fn_t *)mapping;
  mapping_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
        **)this;
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_68.filter_fn_1,filter_fn_1);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_68.filter_fn_2,filter_fn_2);
  Transformer<std::map<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli>>>*,CLI::Transformer::map<std::map<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli>>>*>(std::map<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli>>>*&&,std::function<std::__cxx11::string(std::__cxx11::string)>,std::function<std::__cxx11::string(std::__cxx11::string)>)::_lambda(std::__cxx11::string)_1_>
            (this,mapping_00,&local_68);
  Transformer<std::map<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli>>>*>(std::map<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_28::test()::test_cli>>>*&&,std::function<std::__cxx11::string(std::__cxx11::string)>,std::function<std::__cxx11::string(std::__cxx11::string)>)
  ::{lambda(std::__cxx11::string)#1}::~function((_lambda_std____cxx11__string__1_ *)&local_68);
  return;
}

Assistant:

Transformer(T &&mapping, filter_fn_t filter_fn_1, filter_fn_t filter_fn_2, Args &&...other)
        : Transformer(
              std::forward<T>(mapping),
              [filter_fn_1, filter_fn_2](std::string a) { return filter_fn_2(filter_fn_1(a)); },
              other...) {}